

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::SetTabItemClosed(char *label)

{
  ImGuiTabItem *pIVar1;
  ImGuiTabBar *pIVar2;
  ImGuiDockNode *pIVar3;
  ulong uVar4;
  ImGuiID IVar5;
  ImU32 tab_id;
  ImGuiWindow *docked_window;
  ImGuiTabItem *in_RCX;
  ImGuiTabItem *pIVar6;
  ulong uVar7;
  ImGuiTabItem *pIVar8;
  ulong uVar9;
  bool bVar10;
  
  pIVar2 = GImGui->CurrentTabBar;
  if ((pIVar2 == (ImGuiTabBar *)0x0) || ((pIVar2->Flags & 0x100000) != 0)) {
    docked_window = (ImGuiWindow *)FindWindowByName(label);
    if (docked_window == (ImGuiWindow *)0x0) {
      return;
    }
    if ((docked_window->field_0x3e1 & 1) == 0) {
      return;
    }
    pIVar3 = docked_window->DockNode;
    if (pIVar3 == (ImGuiDockNode *)0x0) {
      return;
    }
    tab_id = TabBarCalcTabID(pIVar3->TabBar,label,docked_window);
    TabBarRemoveTab(pIVar3->TabBar,tab_id);
    docked_window->field_0x3e1 = docked_window->field_0x3e1 | 8;
    return;
  }
  IVar5 = ImGuiWindow::GetID((ImGuiWindow *)GImGui->CurrentWindow,label,(char *)0x0);
  if (IVar5 != 0) {
    uVar7 = (ulong)(pIVar2->Tabs).Size;
    bVar10 = 0 < (long)uVar7;
    if (0 < (long)uVar7) {
      in_RCX = (pIVar2->Tabs).Data;
      bVar10 = true;
      if (in_RCX->ID != IVar5) {
        pIVar8 = in_RCX + (uVar7 - 1);
        pIVar6 = in_RCX;
        uVar4 = 1;
        do {
          uVar9 = uVar4;
          in_RCX = pIVar8;
          if (uVar7 == uVar9) break;
          in_RCX = pIVar6 + 1;
          pIVar1 = pIVar6 + 1;
          pIVar6 = in_RCX;
          uVar4 = uVar9 + 1;
        } while (pIVar1->ID != IVar5);
        bVar10 = uVar9 < uVar7;
      }
    }
    if (bVar10) goto LAB_001f9b54;
  }
  in_RCX = (ImGuiTabItem *)0x0;
LAB_001f9b54:
  if (in_RCX != (ImGuiTabItem *)0x0) {
    in_RCX->WantClose = true;
  }
  return;
}

Assistant:

void    ImGui::SetTabItemClosed(const char* label)
{
    ImGuiContext& g = *GImGui;
    bool is_within_manual_tab_bar = g.CurrentTabBar && !(g.CurrentTabBar->Flags & ImGuiTabBarFlags_DockNode);
    if (is_within_manual_tab_bar)
    {
        ImGuiTabBar* tab_bar = g.CurrentTabBar;
        ImGuiID tab_id = TabBarCalcTabID(tab_bar, label, NULL);
        if (ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, tab_id))
            tab->WantClose = true; // Will be processed by next call to TabBarLayout()
    }
    else if (ImGuiWindow* window = FindWindowByName(label))
    {
        if (window->DockIsActive)
            if (ImGuiDockNode* node = window->DockNode)
            {
                ImGuiID tab_id = TabBarCalcTabID(node->TabBar, label, window);
                TabBarRemoveTab(node->TabBar, tab_id);
                window->DockTabWantClose = true;
            }
    }
}